

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O0

void __thiscall
ZCC_OpInfoType::AddProto
          (ZCC_OpInfoType *this,PType *res,PType *ltype,PType *rtype,EvalConst2op evalconst)

{
  ZCC_OpProto *this_00;
  ZCC_OpProto *proto;
  EvalConst2op evalconst_local;
  PType *rtype_local;
  PType *ltype_local;
  PType *res_local;
  ZCC_OpInfoType *this_local;
  
  if (ltype != (PType *)0x0) {
    this_00 = (ZCC_OpProto *)operator_new(0x28);
    ZCC_OpProto::ZCC_OpProto(this_00,res,ltype,rtype);
    (this_00->field_4).EvalConst2 = evalconst;
    this_00->Next = this->Protos;
    this->Protos = this_00;
    return;
  }
  __assert_fail("ltype != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_expr.cpp"
                ,0x44,"void ZCC_OpInfoType::AddProto(PType *, PType *, PType *, EvalConst2op)");
}

Assistant:

void ZCC_OpInfoType::AddProto(PType *res, PType *ltype, PType *rtype, EvalConst2op evalconst)
{
	assert(ltype != NULL);
	ZCC_OpProto *proto = new ZCC_OpProto(res, ltype, rtype);
	proto->EvalConst2 = evalconst;
	proto->Next = Protos;
	Protos = proto;
}